

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::Node::Dump(Node *this,shared_ptr<Assimp::IOStream> *outfile,bool binary,int indent)

{
  element_type *peVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  string *psVar4;
  string local_210 [8];
  string s;
  ostringstream ss;
  shared_ptr<Assimp::IOStream> local_68;
  undefined1 local_58 [8];
  StreamWriterLE outstream;
  int indent_local;
  bool binary_local;
  shared_ptr<Assimp::IOStream> *outfile_local;
  Node *this_local;
  
  outstream.cursor._0_4_ = indent;
  outstream.cursor._7_1_ = binary;
  if (binary) {
    std::shared_ptr<Assimp::IOStream>::shared_ptr(&local_68,outfile);
    StreamWriter<false,_false>::StreamWriter((StreamWriter<false,_false> *)local_58,&local_68,false)
    ;
    std::shared_ptr<Assimp::IOStream>::~shared_ptr(&local_68);
    DumpBinary(this,(StreamWriterLE *)local_58);
    StreamWriter<false,_false>::~StreamWriter((StreamWriter<false,_false> *)local_58);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(s.field_2._M_local_buf + 8));
    DumpAscii(this,(ostream *)(s.field_2._M_local_buf + 8),(int)outstream.cursor);
    std::__cxx11::ostringstream::str();
    peVar1 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)outfile);
    psVar4 = local_210;
    uVar2 = std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::size();
    (*peVar1->_vptr_IOStream[3])(peVar1,uVar2,uVar3,1,in_R8,in_R9,psVar4);
    std::__cxx11::string::~string(local_210);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(s.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void FBX::Node::Dump(
    std::shared_ptr<Assimp::IOStream> outfile,
    bool binary, int indent
) {
    if (binary) {
        Assimp::StreamWriterLE outstream(outfile);
        DumpBinary(outstream);
    } else {
        std::ostringstream ss;
        DumpAscii(ss, indent);
        std::string s = ss.str();
        outfile->Write(s.c_str(), s.size(), 1);
    }
}